

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_or_many_heap(uint32_t number,roaring_bitmap_t **x)

{
  uint8_t uVar1;
  uint8_t type2;
  uint end_index;
  int iVar2;
  void *pvVar3;
  container_t *c1;
  container_t *c2;
  bool bVar4;
  roaring_bitmap_t *ra;
  uint start_index;
  roaring_bitmap_t *prVar5;
  roaring_pq_t *pq;
  roaring_pq_element_t *prVar6;
  size_t sVar7;
  roaring_array_t *prVar8;
  shared_container_t *psVar9;
  container_t *pcVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  roaring_bitmap_t **pprVar14;
  uint uVar15;
  ushort uVar16;
  roaring_pq_element_t newelement;
  roaring_pq_element_t X;
  roaring_pq_element_t x2;
  ushort local_b6;
  uint local_b4;
  roaring_pq_element_t local_78;
  roaring_pq_element_t local_60;
  roaring_pq_element_t local_48;
  
  if (number == 1) {
    prVar5 = roaring_bitmap_copy(*x);
    return prVar5;
  }
  if (number == 0) {
    prVar5 = roaring_bitmap_create_with_capacity(0);
    return prVar5;
  }
  pq = (roaring_pq_t *)malloc(0x10);
  uVar11 = (ulong)number;
  prVar6 = (roaring_pq_element_t *)malloc(uVar11 * 0x18);
  pq->elements = prVar6;
  pq->size = uVar11;
  pprVar14 = &prVar6->bitmap;
  uVar12 = 0;
  do {
    prVar8 = &x[uVar12]->high_low_container;
    *pprVar14 = (roaring_bitmap_t *)prVar8;
    *(_Bool *)(pprVar14 + -1) = false;
    sVar7 = ra_portable_size_in_bytes(prVar8);
    ((roaring_pq_element_t *)(pprVar14 + -2))->size = sVar7;
    uVar12 = uVar12 + 1;
    pprVar14 = pprVar14 + 3;
  } while (uVar11 != uVar12);
  uVar15 = number >> 1;
  do {
    percolate_down(pq,uVar15);
    bVar4 = 0 < (int)uVar15;
    uVar15 = uVar15 - 1;
  } while (bVar4);
  uVar12 = pq->size;
  do {
    if (uVar12 < 2) {
      pq_poll(&local_60,pq);
      roaring_bitmap_repair_after_lazy(local_60.bitmap);
      free(pq->elements);
      pq->elements = (roaring_pq_element_t *)0x0;
      free(pq);
      return (roaring_bitmap_t *)&(local_60.bitmap)->high_low_container;
    }
    prVar6 = &local_60;
    pq_poll(prVar6,pq);
    pq_poll(&local_48,pq);
    ra = local_48.bitmap;
    prVar5 = local_60.bitmap;
    if ((local_60.is_temporary == true) && (local_48.is_temporary == true)) {
      local_78.size = local_78.size & 0xffffffffffffff00;
      uVar15 = *(uint *)&(local_60.bitmap)->high_low_container;
      if (uVar15 == 0) {
        roaring_bitmap_free(local_60.bitmap);
        prVar8 = &ra->high_low_container;
      }
      else {
        end_index = *(uint *)&(local_48.bitmap)->high_low_container;
        if (end_index == 0) {
          roaring_bitmap_free(local_48.bitmap);
          prVar8 = &prVar5->high_low_container;
        }
        else {
          uVar13 = end_index;
          if ((int)uVar15 < (int)end_index) {
            uVar13 = uVar15;
          }
          prVar8 = &roaring_bitmap_create_with_capacity(uVar13)->high_low_container;
          local_b6 = **(uint16_t **)((long)prVar5 + 0x10);
          uVar16 = **(uint16_t **)((long)ra + 0x10);
          local_b4 = 0;
          uVar13 = 0;
LAB_0011e8c8:
          do {
            if (local_b6 == uVar16) {
              uVar12 = (ulong)(ushort)local_b4;
              if ((int)(local_b4 & 0xffff) < (prVar5->high_low_container).size) {
                psVar9 = (shared_container_t *)(*(void ***)((long)prVar5 + 8))[uVar12];
                if ((*(uint8_t **)((long)prVar5 + 0x18))[uVar12] == '\x04') {
                  psVar9 = (shared_container_t *)
                           shared_container_extract_copy
                                     (psVar9,*(uint8_t **)((long)prVar5 + 0x18) + uVar12);
                }
                uVar11 = (ulong)((local_b4 & 0xffff) * 8);
                *(shared_container_t **)((long)*(void ***)((long)prVar5 + 8) + uVar11) = psVar9;
                uVar1 = (*(uint8_t **)((long)prVar5 + 0x18))[uVar12];
                if (uVar1 == '\x04') {
                  __assert_fail("type1 != SHARED_CONTAINER_TYPE",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                                ,0x4a24,
                                "roaring_bitmap_t *lazy_or_from_lazy_inputs(roaring_bitmap_t *, roaring_bitmap_t *)"
                               );
                }
                uVar12 = (ulong)uVar13 & 0xffff;
                if ((int)uVar12 < (ra->high_low_container).size) {
                  c1 = *(container_t **)((long)*(void ***)((long)prVar5 + 8) + uVar11);
                  psVar9 = (shared_container_t *)(*(void ***)((long)ra + 8))[uVar12];
                  if ((*(uint8_t **)((long)ra + 0x18))[uVar12] == '\x04') {
                    psVar9 = (shared_container_t *)
                             shared_container_extract_copy
                                       (psVar9,*(uint8_t **)((long)ra + 0x18) + uVar12);
                  }
                  uVar11 = (ulong)(uint)((int)uVar12 * 8);
                  *(shared_container_t **)((long)*(void ***)((long)ra + 8) + uVar11) = psVar9;
                  type2 = (*(uint8_t **)((long)ra + 0x18))[uVar12];
                  if (type2 == '\x04') {
                    __assert_fail("type2 != SHARED_CONTAINER_TYPE",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                                  ,0x4a29,
                                  "roaring_bitmap_t *lazy_or_from_lazy_inputs(roaring_bitmap_t *, roaring_bitmap_t *)"
                                 );
                  }
                  c2 = *(container_t **)((long)*(void ***)((long)ra + 8) + uVar11);
                  if ((uVar1 == '\x01') || (type2 != '\x01')) {
                    pcVar10 = container_lazy_ior(c1,uVar1,c2,type2,(uint8_t *)&local_78);
                    container_free(c2,type2);
                    if (pcVar10 != c1) {
                      container_free(c1,uVar1);
                    }
                  }
                  else {
                    pcVar10 = container_lazy_ior(c2,'\x01',c1,uVar1,(uint8_t *)&local_78);
                    container_free(c1,uVar1);
                    if (pcVar10 != c2) {
                      container_free(c2,'\x01');
                    }
                  }
                  uVar1 = (uint8_t)local_78.size;
                  extend_array(prVar8,1);
                  iVar2 = prVar8->size;
                  prVar8->keys[iVar2] = local_b6;
                  prVar8->containers[iVar2] = pcVar10;
                  prVar8->typecodes[iVar2] = uVar1;
                  prVar8->size = prVar8->size + 1;
                  local_b4 = local_b4 + 1;
                  if (end_index - 1 == uVar13 || local_b4 == uVar15) {
                    start_index = uVar13 + 1;
                    break;
                  }
                  local_b6 = (*(uint16_t **)((long)prVar5 + 0x10))[local_b4 & 0xffff];
                  uVar16 = (*(uint16_t **)((long)ra + 0x10))[uVar13 + 1 & 0xffff];
                  uVar13 = uVar13 + 1;
                  goto LAB_0011e8c8;
                }
              }
              __assert_fail("i < ra->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1a95,
                            "void ra_unshare_container_at_index(roaring_array_t *, uint16_t)");
            }
            if (local_b6 < uVar16) {
              uVar1 = (*(uint8_t **)((long)prVar5 + 0x18))[local_b4 & 0xffff];
              pvVar3 = (*(void ***)((long)prVar5 + 8))[local_b4 & 0xffff];
              extend_array(prVar8,1);
              iVar2 = prVar8->size;
              prVar8->keys[iVar2] = local_b6;
              prVar8->containers[iVar2] = pvVar3;
              prVar8->typecodes[iVar2] = uVar1;
              prVar8->size = prVar8->size + 1;
              local_b4 = local_b4 + 1;
              start_index = uVar13;
              if (local_b4 == uVar15) break;
              local_b6 = (*(uint16_t **)((long)prVar5 + 0x10))[local_b4 & 0xffff];
              goto LAB_0011e8c8;
            }
            uVar12 = (ulong)uVar13 & 0xffff;
            uVar1 = (*(uint8_t **)((long)ra + 0x18))[uVar12];
            pvVar3 = (*(void ***)((long)ra + 8))[uVar12];
            extend_array(prVar8,1);
            iVar2 = prVar8->size;
            prVar8->keys[iVar2] = uVar16;
            prVar8->containers[iVar2] = pvVar3;
            prVar8->typecodes[iVar2] = uVar1;
            prVar8->size = prVar8->size + 1;
            start_index = uVar13 + 1;
            if (end_index - 1 != uVar13) {
              uVar16 = (*(uint16_t **)((long)ra + 0x10))[start_index & 0xffff];
            }
            uVar13 = start_index;
          } while (end_index != start_index);
          if (local_b4 == uVar15) {
            ra_append_move_range(prVar8,&ra->high_low_container,start_index,end_index);
          }
          else if (start_index == end_index) {
            ra_append_move_range(prVar8,&prVar5->high_low_container,local_b4,uVar15);
          }
          free(*(void ***)((long)prVar5 + 8));
          *(uint16_t **)((long)prVar5 + 0x10) = (uint16_t *)0x0;
          *(uint8_t **)((long)prVar5 + 0x18) = (uint8_t *)0x0;
          *(undefined8 *)prVar5 = 0;
          *(void ***)((long)prVar5 + 8) = (void **)0x0;
          free(*(void ***)((long)ra + 8));
          *(uint16_t **)((long)ra + 0x10) = (uint16_t *)0x0;
          *(uint8_t **)((long)ra + 0x18) = (uint8_t *)0x0;
          *(undefined8 *)ra = 0;
          *(void ***)((long)ra + 8) = (void **)0x0;
          free(prVar5);
          free(ra);
        }
      }
      local_78.size = ra_portable_size_in_bytes(prVar8);
      local_78.is_temporary =
           &ra->high_low_container != prVar8 || &prVar5->high_low_container != prVar8;
      local_78.bitmap = (roaring_bitmap_t *)prVar8;
      pq_add(pq,&local_78);
    }
    else {
      if (local_48.is_temporary == true) {
        roaring_bitmap_lazy_or_inplace(local_48.bitmap,local_60.bitmap,false);
        local_48.size = ra_portable_size_in_bytes(&ra->high_low_container);
        prVar6 = &local_48;
      }
      else if (local_60.is_temporary == false) {
        prVar8 = &roaring_bitmap_lazy_or(local_60.bitmap,local_48.bitmap,false)->high_low_container;
        local_78.size = ra_portable_size_in_bytes(prVar8);
        local_78.is_temporary = true;
        prVar6 = &local_78;
        local_78.bitmap = (roaring_bitmap_t *)prVar8;
      }
      else {
        roaring_bitmap_lazy_or_inplace(local_60.bitmap,local_48.bitmap,false);
        local_60.size = ra_portable_size_in_bytes(&prVar5->high_low_container);
      }
      pq_add(pq,prVar6);
    }
    uVar12 = pq->size;
  } while( true );
}

Assistant:

roaring_bitmap_t *roaring_bitmap_or_many_heap(uint32_t number,
                                              const roaring_bitmap_t **x) {
    if (number == 0) {
        return roaring_bitmap_create();
    }
    if (number == 1) {
        return roaring_bitmap_copy(x[0]);
    }
    roaring_pq_t *pq = create_pq(x, number);
    while (pq->size > 1) {
        roaring_pq_element_t x1 = pq_poll(pq);
        roaring_pq_element_t x2 = pq_poll(pq);

        if (x1.is_temporary && x2.is_temporary) {
            roaring_bitmap_t *newb =
                lazy_or_from_lazy_inputs(x1.bitmap, x2.bitmap);
            // should normally return a fresh new bitmap *except* that
            // it can return x1.bitmap or x2.bitmap in degenerate cases
            bool temporary = !((newb == x1.bitmap) && (newb == x2.bitmap));
            uint64_t bsize = roaring_bitmap_portable_size_in_bytes(newb);
            roaring_pq_element_t newelement = {
                .size = bsize, .is_temporary = temporary, .bitmap = newb};
            pq_add(pq, &newelement);
        } else if (x2.is_temporary) {
            roaring_bitmap_lazy_or_inplace(x2.bitmap, x1.bitmap, false);
            x2.size = roaring_bitmap_portable_size_in_bytes(x2.bitmap);
            pq_add(pq, &x2);
        } else if (x1.is_temporary) {
            roaring_bitmap_lazy_or_inplace(x1.bitmap, x2.bitmap, false);
            x1.size = roaring_bitmap_portable_size_in_bytes(x1.bitmap);

            pq_add(pq, &x1);
        } else {
            roaring_bitmap_t *newb =
                roaring_bitmap_lazy_or(x1.bitmap, x2.bitmap, false);
            uint64_t bsize = roaring_bitmap_portable_size_in_bytes(newb);
            roaring_pq_element_t newelement = {
                .size = bsize, .is_temporary = true, .bitmap = newb};

            pq_add(pq, &newelement);
        }
    }
    roaring_pq_element_t X = pq_poll(pq);
    roaring_bitmap_t *answer = X.bitmap;
    roaring_bitmap_repair_after_lazy(answer);
    pq_free(pq);
    return answer;
}